

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

_Bool testbinaryfuse8(size_t size,size_t repeated_size)

{
  _Bool _Var1;
  void *pvVar2;
  size_t __size;
  undefined8 in_RSI;
  ulong in_RDI;
  _func_size_t_void_ptr *in_stack_00000010;
  _func_void_void_ptr *in_stack_00000018;
  _func__Bool_uint32_t_void_ptr *in_stack_00000020;
  char *buffer;
  size_t buffer_size;
  size_t i;
  uint64_t *big_set;
  binary_fuse8_t filter;
  char *in_stack_ffffffffffffff68;
  binary_fuse8_t *in_stack_ffffffffffffff70;
  binary_fuse8_t *in_stack_ffffffffffffff78;
  binary_fuse8_t *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  uint32_t size_00;
  ulong uVar3;
  binary_fuse8_t local_50;
  ulong local_20;
  _Bool local_11;
  
  size_00 = (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_20 = in_RDI;
  printf("testing binary fuse8 with size %zu and %zu duplicates\n",in_RDI,in_RSI);
  binary_fuse8_allocate(size_00,in_stack_ffffffffffffff98);
  pvVar2 = malloc(local_20 << 3);
  for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
    *(ulong *)((long)pvVar2 + uVar3 * 8) = uVar3;
  }
  _Var1 = binary_fuse8_populate
                    ((uint64_t *)filter.Fingerprints,filter.ArrayLength,
                     (binary_fuse8_t *)filter._16_8_);
  if (_Var1) {
    free(pvVar2);
    __size = binary_fuse8_serialization_bytes(&local_50);
    pvVar2 = malloc(__size);
    binary_fuse8_serialize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    binary_fuse8_free((binary_fuse8_t *)0x10a200);
    binary_fuse8_deserialize(in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    if (local_50.Size == local_20) {
      free(pvVar2);
      binary_fuse8_free((binary_fuse8_t *)0x10a266);
      local_11 = test(i,buffer_size,buffer,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                      (_func_size_t_void_ptr *)filter._8_8_,
                      (_func_void_void_ptr_char_ptr_size_t *)filter._16_8_,
                      (_func__Bool_void_ptr_char_ptr_size_t *)
                      CONCAT44(filter.ArrayLength,filter.SegmentCountLength),
                      (_func__Bool_uint64_t_ptr_uint32_t_void_ptr *)filter.Fingerprints,
                      (_func__Bool_uint64_t_void_ptr *)repeated_size);
    }
    else {
      printf("size not (de-)serialized correctly, found %d, expected %zu.",(ulong)local_50.Size,
             local_20);
      free(pvVar2);
      binary_fuse8_free((binary_fuse8_t *)0x10a245);
      local_11 = false;
    }
  }
  else {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool testbinaryfuse8(size_t size, size_t repeated_size) {
  printf("testing binary fuse8 with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse8_t filter;

  // size serialization test
  binary_fuse8_allocate((uint32_t)size, &filter);
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i;
  }
  if (!binary_fuse8_populate(big_set, (uint32_t)size, &filter)) {
    return false;
  }
  free(big_set);

  size_t buffer_size = binary_fuse8_serialization_bytes(&filter);
  char *buffer = (char *)malloc(buffer_size);
  binary_fuse8_serialize(&filter, buffer);
  binary_fuse8_free(&filter);
  binary_fuse8_deserialize(&filter, buffer);

  if (filter.Size != size) {
    printf("size not (de-)serialized correctly, found %d, expected %zu.",
           filter.Size, size);
    free(buffer);
    binary_fuse8_free(&filter);
    return false;
  }
  free(buffer);
  binary_fuse8_free(&filter);
  // end of size serialization test

  return test(size, repeated_size, &filter,
              binary_fuse8_allocate_gen,
              binary_fuse8_free_gen,
              binary_fuse8_size_in_bytes_gen,
              binary_fuse8_serialization_bytes_gen,
              binary_fuse8_serialize_gen,
              binary_fuse8_deserialize_gen,
              binary_fuse8_populate_gen,
              binary_fuse8_contain_gen);
}